

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smallprimes.c
# Opt level: O3

void init_smallprimes(void)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  ulong uVar22;
  ulong uVar23;
  long lVar24;
  ulong uVar25;
  long lVar26;
  ulong uVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  ulong uVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  undefined1 extraout_XMM0 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  int iVar60;
  int iVar63;
  int iVar64;
  undefined1 auVar61 [16];
  int iVar65;
  undefined1 auVar62 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  int iVar79;
  int iVar83;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  _Bool A [65536];
  long lStack_100e8;
  long lStack_100e0;
  long lStack_100d8;
  long lStack_100d0;
  long lStack_100c8;
  long lStack_100c0;
  long lStack_100b8;
  long lStack_100b0;
  long lStack_100a8;
  long lStack_100a0;
  long lStack_10098;
  long lStack_10090;
  long lStack_10088;
  long lStack_10080;
  long lStack_10078;
  long lStack_10070;
  long lStack_10060;
  long lStack_10058;
  long lStack_10050;
  ulong uStack_10048;
  char acStack_10038 [65544];
  
  if (smallprimes_array[0] == 0) {
    memset(acStack_10038 + 2,1,0xfffe);
    uVar22 = 2;
    lStack_10070 = 0x22;
    lVar33 = 0x20;
    lStack_10078 = 0x1e;
    lStack_10080 = 0x1c;
    lStack_10088 = 0x1a;
    lStack_10090 = 0x18;
    lStack_10098 = 0x16;
    lStack_100a0 = 0x14;
    lStack_100a8 = 0x12;
    lStack_100b0 = 0x10;
    lStack_100b8 = 0xe;
    lStack_100c0 = 0xc;
    lStack_100c8 = 10;
    lStack_100d0 = 8;
    lStack_100d8 = 4;
    uVar27 = 6;
    lStack_100e0 = -6;
    lStack_100e8 = 0;
    auVar40 = extraout_XMM0;
    do {
      uVar25 = 0x10000;
      if (0x10000 < uVar27) {
        uVar25 = uVar27;
      }
      if ((uVar22 < 0x8000) && (acStack_10038[uVar22] != '\0')) {
        uVar23 = lStack_100e8 * 3 + 6;
        if (uVar23 < 0x10001) {
          uVar23 = 0x10000;
        }
        lVar24 = uVar23 + lStack_100e8 * -3 + -6;
        uVar23 = (ulong)(lVar24 != 0);
        lVar24 = (lVar24 - uVar23) / uVar22 + uVar23;
        auVar57._8_4_ = (int)lVar24;
        auVar57._0_8_ = lVar24;
        auVar57._12_4_ = (int)((ulong)lVar24 >> 0x20);
        lStack_10050 = lStack_100d8;
        lStack_10058 = lStack_100d0;
        lStack_10060 = lStack_100c8;
        uVar34 = 0;
        lVar24 = lStack_10078;
        lVar26 = lVar33;
        lVar28 = lStack_10070;
        lVar29 = lStack_10088;
        lVar30 = lStack_100b8;
        lVar31 = lStack_10080;
        lVar32 = lStack_100c0;
        lVar35 = lStack_10098;
        lVar36 = lStack_100a8;
        lVar37 = lStack_100b0;
        lVar38 = lStack_100a0;
        lVar39 = lStack_10090;
        uStack_10048 = uVar27;
        do {
          auVar58._8_4_ = (int)uVar34;
          auVar58._0_8_ = uVar34;
          auVar58._12_4_ = (int)(uVar34 >> 0x20);
          auVar61 = auVar57 ^ _DAT_0013f590;
          auVar66 = (auVar58 | _DAT_0013f580) ^ _DAT_0013f590;
          iVar60 = auVar61._0_4_;
          iVar79 = -(uint)(iVar60 < auVar66._0_4_);
          iVar63 = auVar61._4_4_;
          auVar68._4_4_ = -(uint)(iVar63 < auVar66._4_4_);
          iVar64 = auVar61._8_4_;
          iVar83 = -(uint)(iVar64 < auVar66._8_4_);
          iVar65 = auVar61._12_4_;
          auVar68._12_4_ = -(uint)(iVar65 < auVar66._12_4_);
          auVar61._4_4_ = iVar79;
          auVar61._0_4_ = iVar79;
          auVar61._8_4_ = iVar83;
          auVar61._12_4_ = iVar83;
          auVar61 = pshuflw(auVar40,auVar61,0xe8);
          auVar67._4_4_ = -(uint)(auVar66._4_4_ == iVar63);
          auVar67._12_4_ = -(uint)(auVar66._12_4_ == iVar65);
          auVar67._0_4_ = auVar67._4_4_;
          auVar67._8_4_ = auVar67._12_4_;
          auVar49 = pshuflw(in_XMM1,auVar67,0xe8);
          auVar68._0_4_ = auVar68._4_4_;
          auVar68._8_4_ = auVar68._12_4_;
          auVar66 = pshuflw(auVar61,auVar68,0xe8);
          auVar40._8_4_ = 0xffffffff;
          auVar40._0_8_ = 0xffffffffffffffff;
          auVar40._12_4_ = 0xffffffff;
          auVar40 = (auVar66 | auVar49 & auVar61) ^ auVar40;
          auVar40 = packssdw(auVar40,auVar40);
          if ((auVar40 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            acStack_10038[lStack_10050] = '\0';
          }
          auVar49._4_4_ = iVar79;
          auVar49._0_4_ = iVar79;
          auVar49._8_4_ = iVar83;
          auVar49._12_4_ = iVar83;
          auVar68 = auVar67 & auVar49 | auVar68;
          auVar40 = packssdw(auVar68,auVar68);
          auVar66._8_4_ = 0xffffffff;
          auVar66._0_8_ = 0xffffffffffffffff;
          auVar66._12_4_ = 0xffffffff;
          auVar40 = packssdw(auVar40 ^ auVar66,auVar40 ^ auVar66);
          auVar40 = packsswb(auVar40,auVar40);
          if ((auVar40._0_4_ >> 8 & 1) != 0) {
            acStack_10038[uStack_10048] = '\0';
          }
          auVar40 = (auVar58 | _DAT_0013f570) ^ _DAT_0013f590;
          auVar50._0_4_ = -(uint)(iVar60 < auVar40._0_4_);
          auVar50._4_4_ = -(uint)(iVar63 < auVar40._4_4_);
          auVar50._8_4_ = -(uint)(iVar64 < auVar40._8_4_);
          auVar50._12_4_ = -(uint)(iVar65 < auVar40._12_4_);
          auVar69._4_4_ = auVar50._0_4_;
          auVar69._0_4_ = auVar50._0_4_;
          auVar69._8_4_ = auVar50._8_4_;
          auVar69._12_4_ = auVar50._8_4_;
          iVar79 = -(uint)(auVar40._4_4_ == iVar63);
          iVar83 = -(uint)(auVar40._12_4_ == iVar65);
          auVar10._4_4_ = iVar79;
          auVar10._0_4_ = iVar79;
          auVar10._8_4_ = iVar83;
          auVar10._12_4_ = iVar83;
          auVar80._4_4_ = auVar50._4_4_;
          auVar80._0_4_ = auVar50._4_4_;
          auVar80._8_4_ = auVar50._12_4_;
          auVar80._12_4_ = auVar50._12_4_;
          auVar40 = auVar10 & auVar69 | auVar80;
          auVar40 = packssdw(auVar40,auVar40);
          auVar1._8_4_ = 0xffffffff;
          auVar1._0_8_ = 0xffffffffffffffff;
          auVar1._12_4_ = 0xffffffff;
          auVar40 = packssdw(auVar40 ^ auVar1,auVar40 ^ auVar1);
          auVar40 = packsswb(auVar40,auVar40);
          if ((auVar40._0_4_ >> 0x10 & 1) != 0) {
            acStack_10038[lStack_10058] = '\0';
          }
          auVar40 = pshufhw(auVar40,auVar69,0x84);
          auVar11._4_4_ = iVar79;
          auVar11._0_4_ = iVar79;
          auVar11._8_4_ = iVar83;
          auVar11._12_4_ = iVar83;
          auVar66 = pshufhw(auVar50,auVar11,0x84);
          auVar61 = pshufhw(auVar40,auVar80,0x84);
          auVar41._8_4_ = 0xffffffff;
          auVar41._0_8_ = 0xffffffffffffffff;
          auVar41._12_4_ = 0xffffffff;
          auVar41 = (auVar61 | auVar66 & auVar40) ^ auVar41;
          auVar40 = packssdw(auVar41,auVar41);
          auVar40 = packsswb(auVar40,auVar40);
          if ((auVar40._0_4_ >> 0x18 & 1) != 0) {
            acStack_10038[lStack_10060] = '\0';
          }
          auVar40 = (auVar58 | _DAT_0013f560) ^ _DAT_0013f590;
          auVar51._0_4_ = -(uint)(iVar60 < auVar40._0_4_);
          auVar51._4_4_ = -(uint)(iVar63 < auVar40._4_4_);
          auVar51._8_4_ = -(uint)(iVar64 < auVar40._8_4_);
          auVar51._12_4_ = -(uint)(iVar65 < auVar40._12_4_);
          auVar12._4_4_ = auVar51._0_4_;
          auVar12._0_4_ = auVar51._0_4_;
          auVar12._8_4_ = auVar51._8_4_;
          auVar12._12_4_ = auVar51._8_4_;
          auVar66 = pshuflw(auVar80,auVar12,0xe8);
          auVar42._0_4_ = -(uint)(auVar40._0_4_ == iVar60);
          auVar42._4_4_ = -(uint)(auVar40._4_4_ == iVar63);
          auVar42._8_4_ = -(uint)(auVar40._8_4_ == iVar64);
          auVar42._12_4_ = -(uint)(auVar40._12_4_ == iVar65);
          auVar70._4_4_ = auVar42._4_4_;
          auVar70._0_4_ = auVar42._4_4_;
          auVar70._8_4_ = auVar42._12_4_;
          auVar70._12_4_ = auVar42._12_4_;
          auVar40 = pshuflw(auVar42,auVar70,0xe8);
          auVar71._4_4_ = auVar51._4_4_;
          auVar71._0_4_ = auVar51._4_4_;
          auVar71._8_4_ = auVar51._12_4_;
          auVar71._12_4_ = auVar51._12_4_;
          auVar61 = pshuflw(auVar51,auVar71,0xe8);
          auVar2._8_4_ = 0xffffffff;
          auVar2._0_8_ = 0xffffffffffffffff;
          auVar2._12_4_ = 0xffffffff;
          auVar40 = packssdw(auVar40 & auVar66,(auVar61 | auVar40 & auVar66) ^ auVar2);
          auVar40 = packsswb(auVar40,auVar40);
          if ((auVar40 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            acStack_10038[lVar32] = '\0';
          }
          auVar13._4_4_ = auVar51._0_4_;
          auVar13._0_4_ = auVar51._0_4_;
          auVar13._8_4_ = auVar51._8_4_;
          auVar13._12_4_ = auVar51._8_4_;
          auVar71 = auVar70 & auVar13 | auVar71;
          auVar61 = packssdw(auVar71,auVar71);
          auVar3._8_4_ = 0xffffffff;
          auVar3._0_8_ = 0xffffffffffffffff;
          auVar3._12_4_ = 0xffffffff;
          auVar40 = packssdw(auVar40,auVar61 ^ auVar3);
          auVar40 = packsswb(auVar40,auVar40);
          if ((auVar40._4_2_ >> 8 & 1) != 0) {
            acStack_10038[lVar30] = '\0';
          }
          auVar40 = (auVar58 | _DAT_0013f550) ^ _DAT_0013f590;
          auVar52._0_4_ = -(uint)(iVar60 < auVar40._0_4_);
          auVar52._4_4_ = -(uint)(iVar63 < auVar40._4_4_);
          auVar52._8_4_ = -(uint)(iVar64 < auVar40._8_4_);
          auVar52._12_4_ = -(uint)(iVar65 < auVar40._12_4_);
          auVar72._4_4_ = auVar52._0_4_;
          auVar72._0_4_ = auVar52._0_4_;
          auVar72._8_4_ = auVar52._8_4_;
          auVar72._12_4_ = auVar52._8_4_;
          iVar79 = -(uint)(auVar40._4_4_ == iVar63);
          iVar83 = -(uint)(auVar40._12_4_ == iVar65);
          auVar14._4_4_ = iVar79;
          auVar14._0_4_ = iVar79;
          auVar14._8_4_ = iVar83;
          auVar14._12_4_ = iVar83;
          auVar81._4_4_ = auVar52._4_4_;
          auVar81._0_4_ = auVar52._4_4_;
          auVar81._8_4_ = auVar52._12_4_;
          auVar81._12_4_ = auVar52._12_4_;
          auVar40 = auVar14 & auVar72 | auVar81;
          auVar40 = packssdw(auVar40,auVar40);
          auVar4._8_4_ = 0xffffffff;
          auVar4._0_8_ = 0xffffffffffffffff;
          auVar4._12_4_ = 0xffffffff;
          auVar40 = packssdw(auVar40 ^ auVar4,auVar40 ^ auVar4);
          auVar40 = packsswb(auVar40,auVar40);
          if ((auVar40 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            acStack_10038[lVar37] = '\0';
          }
          auVar40 = pshufhw(auVar40,auVar72,0x84);
          auVar15._4_4_ = iVar79;
          auVar15._0_4_ = iVar79;
          auVar15._8_4_ = iVar83;
          auVar15._12_4_ = iVar83;
          auVar66 = pshufhw(auVar52,auVar15,0x84);
          auVar61 = pshufhw(auVar40,auVar81,0x84);
          auVar43._8_4_ = 0xffffffff;
          auVar43._0_8_ = 0xffffffffffffffff;
          auVar43._12_4_ = 0xffffffff;
          auVar43 = (auVar61 | auVar66 & auVar40) ^ auVar43;
          auVar40 = packssdw(auVar43,auVar43);
          auVar40 = packsswb(auVar40,auVar40);
          if ((auVar40._6_2_ >> 8 & 1) != 0) {
            acStack_10038[lVar36] = '\0';
          }
          auVar40 = (auVar58 | _DAT_0013f540) ^ _DAT_0013f590;
          auVar53._0_4_ = -(uint)(iVar60 < auVar40._0_4_);
          auVar53._4_4_ = -(uint)(iVar63 < auVar40._4_4_);
          auVar53._8_4_ = -(uint)(iVar64 < auVar40._8_4_);
          auVar53._12_4_ = -(uint)(iVar65 < auVar40._12_4_);
          auVar16._4_4_ = auVar53._0_4_;
          auVar16._0_4_ = auVar53._0_4_;
          auVar16._8_4_ = auVar53._8_4_;
          auVar16._12_4_ = auVar53._8_4_;
          auVar66 = pshuflw(auVar81,auVar16,0xe8);
          auVar44._0_4_ = -(uint)(auVar40._0_4_ == iVar60);
          auVar44._4_4_ = -(uint)(auVar40._4_4_ == iVar63);
          auVar44._8_4_ = -(uint)(auVar40._8_4_ == iVar64);
          auVar44._12_4_ = -(uint)(auVar40._12_4_ == iVar65);
          auVar73._4_4_ = auVar44._4_4_;
          auVar73._0_4_ = auVar44._4_4_;
          auVar73._8_4_ = auVar44._12_4_;
          auVar73._12_4_ = auVar44._12_4_;
          auVar40 = pshuflw(auVar44,auVar73,0xe8);
          auVar74._4_4_ = auVar53._4_4_;
          auVar74._0_4_ = auVar53._4_4_;
          auVar74._8_4_ = auVar53._12_4_;
          auVar74._12_4_ = auVar53._12_4_;
          auVar61 = pshuflw(auVar53,auVar74,0xe8);
          auVar54._8_4_ = 0xffffffff;
          auVar54._0_8_ = 0xffffffffffffffff;
          auVar54._12_4_ = 0xffffffff;
          auVar54 = (auVar61 | auVar40 & auVar66) ^ auVar54;
          auVar61 = packssdw(auVar54,auVar54);
          auVar40 = packsswb(auVar40 & auVar66,auVar61);
          if ((auVar40 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            acStack_10038[lVar38] = '\0';
          }
          auVar17._4_4_ = auVar53._0_4_;
          auVar17._0_4_ = auVar53._0_4_;
          auVar17._8_4_ = auVar53._8_4_;
          auVar17._12_4_ = auVar53._8_4_;
          auVar74 = auVar73 & auVar17 | auVar74;
          auVar61 = packssdw(auVar74,auVar74);
          auVar5._8_4_ = 0xffffffff;
          auVar5._0_8_ = 0xffffffffffffffff;
          auVar5._12_4_ = 0xffffffff;
          auVar61 = packssdw(auVar61 ^ auVar5,auVar61 ^ auVar5);
          auVar40 = packsswb(auVar40,auVar61);
          if ((auVar40._8_2_ >> 8 & 1) != 0) {
            acStack_10038[lVar35] = '\0';
          }
          auVar40 = (auVar58 | _DAT_0013f530) ^ _DAT_0013f590;
          auVar55._0_4_ = -(uint)(iVar60 < auVar40._0_4_);
          auVar55._4_4_ = -(uint)(iVar63 < auVar40._4_4_);
          auVar55._8_4_ = -(uint)(iVar64 < auVar40._8_4_);
          auVar55._12_4_ = -(uint)(iVar65 < auVar40._12_4_);
          auVar75._4_4_ = auVar55._0_4_;
          auVar75._0_4_ = auVar55._0_4_;
          auVar75._8_4_ = auVar55._8_4_;
          auVar75._12_4_ = auVar55._8_4_;
          iVar79 = -(uint)(auVar40._4_4_ == iVar63);
          iVar83 = -(uint)(auVar40._12_4_ == iVar65);
          auVar18._4_4_ = iVar79;
          auVar18._0_4_ = iVar79;
          auVar18._8_4_ = iVar83;
          auVar18._12_4_ = iVar83;
          auVar82._4_4_ = auVar55._4_4_;
          auVar82._0_4_ = auVar55._4_4_;
          auVar82._8_4_ = auVar55._12_4_;
          auVar82._12_4_ = auVar55._12_4_;
          auVar40 = auVar18 & auVar75 | auVar82;
          auVar40 = packssdw(auVar40,auVar40);
          auVar6._8_4_ = 0xffffffff;
          auVar6._0_8_ = 0xffffffffffffffff;
          auVar6._12_4_ = 0xffffffff;
          auVar40 = packssdw(auVar40 ^ auVar6,auVar40 ^ auVar6);
          auVar40 = packsswb(auVar40,auVar40);
          if ((auVar40 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            acStack_10038[lVar39] = '\0';
          }
          auVar40 = pshufhw(auVar40,auVar75,0x84);
          auVar19._4_4_ = iVar79;
          auVar19._0_4_ = iVar79;
          auVar19._8_4_ = iVar83;
          auVar19._12_4_ = iVar83;
          auVar66 = pshufhw(auVar55,auVar19,0x84);
          auVar61 = pshufhw(auVar40,auVar82,0x84);
          auVar45._8_4_ = 0xffffffff;
          auVar45._0_8_ = 0xffffffffffffffff;
          auVar45._12_4_ = 0xffffffff;
          auVar45 = (auVar61 | auVar66 & auVar40) ^ auVar45;
          auVar40 = packssdw(auVar45,auVar45);
          auVar40 = packsswb(auVar40,auVar40);
          if ((auVar40._10_2_ >> 8 & 1) != 0) {
            acStack_10038[lVar29] = '\0';
          }
          auVar40 = (auVar58 | _DAT_0013f520) ^ _DAT_0013f590;
          auVar56._0_4_ = -(uint)(iVar60 < auVar40._0_4_);
          auVar56._4_4_ = -(uint)(iVar63 < auVar40._4_4_);
          auVar56._8_4_ = -(uint)(iVar64 < auVar40._8_4_);
          auVar56._12_4_ = -(uint)(iVar65 < auVar40._12_4_);
          auVar20._4_4_ = auVar56._0_4_;
          auVar20._0_4_ = auVar56._0_4_;
          auVar20._8_4_ = auVar56._8_4_;
          auVar20._12_4_ = auVar56._8_4_;
          auVar66 = pshuflw(auVar82,auVar20,0xe8);
          auVar46._0_4_ = -(uint)(auVar40._0_4_ == iVar60);
          auVar46._4_4_ = -(uint)(auVar40._4_4_ == iVar63);
          auVar46._8_4_ = -(uint)(auVar40._8_4_ == iVar64);
          auVar46._12_4_ = -(uint)(auVar40._12_4_ == iVar65);
          auVar76._4_4_ = auVar46._4_4_;
          auVar76._0_4_ = auVar46._4_4_;
          auVar76._8_4_ = auVar46._12_4_;
          auVar76._12_4_ = auVar46._12_4_;
          auVar40 = pshuflw(auVar46,auVar76,0xe8);
          auVar77._4_4_ = auVar56._4_4_;
          auVar77._0_4_ = auVar56._4_4_;
          auVar77._8_4_ = auVar56._12_4_;
          auVar77._12_4_ = auVar56._12_4_;
          auVar61 = pshuflw(auVar56,auVar77,0xe8);
          auVar7._8_4_ = 0xffffffff;
          auVar7._0_8_ = 0xffffffffffffffff;
          auVar7._12_4_ = 0xffffffff;
          auVar40 = packssdw(auVar40 & auVar66,(auVar61 | auVar40 & auVar66) ^ auVar7);
          auVar40 = packsswb(auVar40,auVar40);
          if ((auVar40 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            acStack_10038[lVar31] = '\0';
          }
          auVar21._4_4_ = auVar56._0_4_;
          auVar21._0_4_ = auVar56._0_4_;
          auVar21._8_4_ = auVar56._8_4_;
          auVar21._12_4_ = auVar56._8_4_;
          auVar77 = auVar76 & auVar21 | auVar77;
          auVar61 = packssdw(auVar77,auVar77);
          auVar8._8_4_ = 0xffffffff;
          auVar8._0_8_ = 0xffffffffffffffff;
          auVar8._12_4_ = 0xffffffff;
          auVar40 = packssdw(auVar40,auVar61 ^ auVar8);
          auVar40 = packsswb(auVar40,auVar40);
          if ((auVar40._12_2_ >> 8 & 1) != 0) {
            acStack_10038[lVar24] = '\0';
          }
          auVar40 = (auVar58 | _DAT_0013f510) ^ _DAT_0013f590;
          auVar47._0_4_ = -(uint)(iVar60 < auVar40._0_4_);
          auVar47._4_4_ = -(uint)(iVar63 < auVar40._4_4_);
          auVar47._8_4_ = -(uint)(iVar64 < auVar40._8_4_);
          auVar47._12_4_ = -(uint)(iVar65 < auVar40._12_4_);
          auVar78._4_4_ = auVar47._0_4_;
          auVar78._0_4_ = auVar47._0_4_;
          auVar78._8_4_ = auVar47._8_4_;
          auVar78._12_4_ = auVar47._8_4_;
          auVar59._4_4_ = -(uint)(auVar40._4_4_ == iVar63);
          auVar59._12_4_ = -(uint)(auVar40._12_4_ == iVar65);
          auVar59._0_4_ = auVar59._4_4_;
          auVar59._8_4_ = auVar59._12_4_;
          auVar62._4_4_ = auVar47._4_4_;
          auVar62._0_4_ = auVar47._4_4_;
          auVar62._8_4_ = auVar47._12_4_;
          auVar62._12_4_ = auVar47._12_4_;
          auVar61 = auVar59 & auVar78 | auVar62;
          auVar40 = packssdw(auVar47,auVar61);
          auVar9._8_4_ = 0xffffffff;
          auVar9._0_8_ = 0xffffffffffffffff;
          auVar9._12_4_ = 0xffffffff;
          auVar40 = packssdw(auVar40 ^ auVar9,auVar40 ^ auVar9);
          auVar40 = packsswb(auVar40,auVar40);
          if ((auVar40 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            acStack_10038[lVar26] = '\0';
          }
          auVar40 = pshufhw(auVar40,auVar78,0x84);
          in_XMM1 = pshufhw(auVar61,auVar59,0x84);
          in_XMM1 = in_XMM1 & auVar40;
          auVar40 = pshufhw(auVar40,auVar62,0x84);
          auVar48._8_4_ = 0xffffffff;
          auVar48._0_8_ = 0xffffffffffffffff;
          auVar48._12_4_ = 0xffffffff;
          auVar48 = (auVar40 | in_XMM1) ^ auVar48;
          auVar40 = packssdw(auVar48,auVar48);
          auVar40 = packsswb(auVar40,auVar40);
          if ((auVar40._14_2_ >> 8 & 1) != 0) {
            acStack_10038[lVar28] = '\0';
          }
          uVar34 = uVar34 + 0x10;
          lVar28 = lVar28 + lVar33;
          lVar26 = lVar26 + lVar33;
          lVar24 = lVar24 + lVar33;
          lVar31 = lVar31 + lVar33;
          lVar29 = lVar29 + lVar33;
          lVar39 = lVar39 + lVar33;
          lVar35 = lVar35 + lVar33;
          lVar38 = lVar38 + lVar33;
          lVar36 = lVar36 + lVar33;
          lVar37 = lVar37 + lVar33;
          lVar30 = lVar30 + lVar33;
          lVar32 = lVar32 + lVar33;
          lStack_10060 = lStack_10060 + lVar33;
          lStack_10058 = lStack_10058 + lVar33;
          lStack_10050 = lStack_10050 + lVar33;
          uStack_10048 = uStack_10048 + lVar33;
        } while ((((uVar25 + lStack_100e0) - uVar23) / uVar22 + uVar23 + 0x10 & 0xfffffffffffffff0)
                 != uVar34);
      }
      uVar22 = uVar22 + 1;
      lStack_100e8 = lStack_100e8 + 1;
      lStack_10070 = lStack_10070 + 0x11;
      lVar33 = lVar33 + 0x10;
      lStack_10078 = lStack_10078 + 0xf;
      lStack_10080 = lStack_10080 + 0xe;
      lStack_10088 = lStack_10088 + 0xd;
      lStack_10090 = lStack_10090 + 0xc;
      lStack_10098 = lStack_10098 + 0xb;
      lStack_100a0 = lStack_100a0 + 10;
      lStack_100a8 = lStack_100a8 + 9;
      lStack_100b0 = lStack_100b0 + 8;
      lStack_100b8 = lStack_100b8 + 7;
      lStack_100c0 = lStack_100c0 + 6;
      lStack_100c8 = lStack_100c8 + 5;
      lStack_100d0 = lStack_100d0 + 4;
      lStack_100d8 = lStack_100d8 + 2;
      uVar27 = uVar27 + 3;
      lStack_100e0 = lStack_100e0 + -3;
    } while (uVar22 != 0x10000);
    lVar33 = 2;
    uVar22 = 0;
    do {
      if (acStack_10038[lVar33] == '\x01') {
        if (0x198d < uVar22) {
          __assert_fail("pos < NSMALLPRIMES",
                        "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/keygen/smallprimes.c"
                        ,0x26,"void init_smallprimes(void)");
        }
        smallprimes_array[uVar22] = (unsigned_short)lVar33;
        uVar22 = uVar22 + 1;
      }
      lVar33 = lVar33 + 1;
    } while (lVar33 != 0x10000);
    if (uVar22 != 0x198e) {
      __assert_fail("pos == NSMALLPRIMES",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/keygen/smallprimes.c"
                    ,0x2b,"void init_smallprimes(void)");
    }
  }
  return;
}

Assistant:

void init_smallprimes(void)
{
    if (smallprimes_array[0])
        return;                        /* already done */

    bool A[65536];

    for (size_t i = 2; i < lenof(A); i++)
        A[i] = true;

    for (size_t i = 2; i < lenof(A); i++) {
        if (!A[i])
            continue;
        for (size_t j = 2*i; j < lenof(A); j += i)
            A[j] = false;
    }

    size_t pos = 0;
    for (size_t i = 2; i < lenof(A); i++) {
        if (A[i]) {
            assert(pos < NSMALLPRIMES);
            smallprimes_array[pos++] = i;
        }
    }

    assert(pos == NSMALLPRIMES);
}